

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared-validator.cc
# Opt level: O2

Result __thiscall
wabt::SharedValidator::OnCatch(SharedValidator *this,Location *loc,Var *tag_var,bool is_catch_all)

{
  Result RVar1;
  Result RVar2;
  Result RVar3;
  undefined3 in_register_00000009;
  bool bVar4;
  TypeVector empty;
  Var local_70;
  
  RVar1 = CheckInstr(this,(Opcode)0x7,loc);
  if (CONCAT31(in_register_00000009,is_catch_all) == 0) {
    empty.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    empty.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    empty.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    Var::Var(&local_70,tag_var);
    RVar2 = CheckTagIndex(this,&local_70,(TagType *)&empty);
    Var::~Var(&local_70);
    RVar3 = TypeChecker::OnCatch(&this->typechecker_,&empty);
    bVar4 = RVar3.enum_ == Error || (RVar2.enum_ == Error || RVar1.enum_ == Error);
  }
  else {
    empty.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    empty.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    empty.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    RVar2 = TypeChecker::OnCatch(&this->typechecker_,&empty);
    bVar4 = RVar2.enum_ == Error || RVar1.enum_ == Error;
  }
  std::_Vector_base<wabt::Type,_std::allocator<wabt::Type>_>::~_Vector_base
            (&empty.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>);
  RVar1.enum_._1_3_ = 0;
  RVar1.enum_._0_1_ = bVar4;
  return (Result)RVar1.enum_;
}

Assistant:

Result SharedValidator::OnCatch(const Location& loc,
                                Var tag_var,
                                bool is_catch_all) {
  Result result = CheckInstr(Opcode::Catch, loc);
  if (is_catch_all) {
    TypeVector empty;
    result |= typechecker_.OnCatch(empty);
  } else {
    TagType tag_type;
    result |= CheckTagIndex(tag_var, &tag_type);
    result |= typechecker_.OnCatch(tag_type.params);
  }
  return result;
}